

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

Token __thiscall Lexer::ReadToken(Lexer *this)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  Token TVar4;
  ulong uVar5;
  Token TVar6;
  byte *pbVar7;
  byte bVar8;
  
  pbVar7 = (byte *)this->ofs_;
LAB_00122b17:
  bVar8 = *pbVar7;
  if (bVar8 == 0x20) goto code_r0x00122b1f;
  pbVar3 = pbVar7;
  if (0x5e < bVar8) {
    if (bVar8 < 0x6a) {
      if (bVar8 < 99) {
        if (bVar8 == 0x60) goto LAB_00122e6f;
        if (bVar8 != 0x62) goto LAB_00122f1d;
        bVar8 = pbVar7[1];
        if (bVar8 != 0x75) goto LAB_00122ef3;
        bVar8 = pbVar7[2];
        if (bVar8 != 0x69) goto LAB_00122ef9;
        bVar8 = pbVar7[3];
        if (bVar8 != 0x6c) goto LAB_00122eff;
        bVar8 = pbVar7[4];
        if (bVar8 != 100) goto LAB_00122f05;
        pbVar3 = pbVar7 + 5;
        uVar5 = (ulong)pbVar7[5];
        TVar6 = BUILD;
      }
      else if (bVar8 == 100) {
        bVar8 = pbVar7[1];
        if (bVar8 != 0x65) goto LAB_00122ef3;
        bVar8 = pbVar7[2];
        if (bVar8 != 0x66) goto LAB_00122ef9;
        bVar8 = pbVar7[3];
        if (bVar8 != 0x61) goto LAB_00122eff;
        bVar8 = pbVar7[4];
        if (bVar8 != 0x75) goto LAB_00122f05;
        bVar8 = pbVar7[5];
        if (bVar8 != 0x6c) goto LAB_00122f0b;
        bVar8 = pbVar7[6];
        if (bVar8 != 0x74) goto LAB_00122f11;
        pbVar3 = pbVar7 + 7;
        uVar5 = (ulong)pbVar7[7];
        TVar6 = DEFAULT;
      }
      else {
        if (bVar8 != 0x69) goto LAB_00122f1d;
        bVar8 = pbVar7[1];
        if (bVar8 != 0x6e) {
LAB_00122ef3:
          pbVar3 = pbVar7 + 1;
          goto LAB_00122f23;
        }
        bVar8 = pbVar7[2];
        if (bVar8 != 99) {
LAB_00122ef9:
          pbVar3 = pbVar7 + 2;
          goto LAB_00122f23;
        }
        bVar8 = pbVar7[3];
        if (bVar8 != 0x6c) {
LAB_00122eff:
          pbVar3 = pbVar7 + 3;
          goto LAB_00122f23;
        }
        bVar8 = pbVar7[4];
        if (bVar8 != 0x75) {
LAB_00122f05:
          pbVar3 = pbVar7 + 4;
          goto LAB_00122f23;
        }
        bVar8 = pbVar7[5];
        if (bVar8 != 100) {
LAB_00122f0b:
          pbVar3 = pbVar7 + 5;
          goto LAB_00122f23;
        }
        bVar8 = pbVar7[6];
        if (bVar8 != 0x65) {
LAB_00122f11:
          pbVar3 = pbVar7 + 6;
          goto LAB_00122f23;
        }
        pbVar3 = pbVar7 + 7;
        uVar5 = (ulong)pbVar7[7];
        TVar6 = INCLUDE;
      }
    }
    else if (bVar8 < 0x73) {
      if (bVar8 == 0x70) {
        bVar8 = pbVar7[1];
        if (bVar8 != 0x6f) goto LAB_00122ef3;
        bVar8 = pbVar7[2];
        if (bVar8 != 0x6f) goto LAB_00122ef9;
        bVar8 = pbVar7[3];
        if (bVar8 != 0x6c) goto LAB_00122eff;
        pbVar3 = pbVar7 + 4;
        uVar5 = (ulong)pbVar7[4];
        TVar6 = POOL;
      }
      else {
        if (bVar8 != 0x72) goto LAB_00122f1d;
        bVar8 = pbVar7[1];
        if (bVar8 != 0x75) goto LAB_00122ef3;
        bVar8 = pbVar7[2];
        if (bVar8 != 0x6c) goto LAB_00122ef9;
        bVar8 = pbVar7[3];
        if (bVar8 != 0x65) goto LAB_00122eff;
        pbVar3 = pbVar7 + 4;
        uVar5 = (ulong)pbVar7[4];
        TVar6 = RULE;
      }
    }
    else {
      if (0x7a < bVar8) {
        if (bVar8 != 0x7c) goto LAB_00122e6f;
        pbVar3 = pbVar7 + 1;
        if (pbVar7[1] == 0x7c) {
          pbVar3 = pbVar7 + 2;
        }
        TVar6 = (pbVar7[1] == 0x7c) + PIPE;
        goto LAB_00122f38;
      }
      if (bVar8 != 0x73) goto LAB_00122f1d;
      bVar8 = pbVar7[1];
      if (bVar8 != 0x75) goto LAB_00122ef3;
      bVar8 = pbVar7[2];
      if (bVar8 != 0x62) goto LAB_00122ef9;
      bVar8 = pbVar7[3];
      if (bVar8 != 0x6e) goto LAB_00122eff;
      bVar8 = pbVar7[4];
      if (bVar8 != 0x69) goto LAB_00122f05;
      bVar8 = pbVar7[5];
      if (bVar8 != 0x6e) goto LAB_00122f0b;
      bVar8 = pbVar7[6];
      if (bVar8 != 0x6a) goto LAB_00122f11;
      bVar8 = pbVar7[7];
      if (bVar8 != 0x61) {
        pbVar3 = pbVar7 + 7;
        goto LAB_00122f23;
      }
      pbVar3 = pbVar7 + 8;
      uVar5 = (ulong)pbVar7[8];
      TVar6 = SUBNINJA;
    }
    if ((""[uVar5] & 0x40) != 0) {
LAB_00122f1d:
      do {
        bVar8 = pbVar3[1];
        pbVar3 = pbVar3 + 1;
LAB_00122f23:
      } while ((""[bVar8] & 0x40) != 0);
      TVar6 = IDENT;
    }
    goto LAB_00122f38;
  }
  if (bVar8 < 0x2d) {
    if (bVar8 < 0xd) {
      pbVar2 = pbVar7;
      if (bVar8 == 0) {
        TVar4 = TEOF;
      }
      else {
        if (bVar8 != 10) goto LAB_00122e6f;
        TVar4 = NEWLINE;
      }
      goto LAB_00122d40;
    }
    if (bVar8 == 0x23) {
      pbVar3 = pbVar7 + 1;
      bVar8 = pbVar7[1];
      bVar1 = true;
      pbVar2 = pbVar3;
      if (bVar8 == 0) goto LAB_00122e6f;
      while (bVar8 != 10) {
        if (bVar8 == 0) {
          TVar6 = INDENT;
          if (bVar1) {
            TVar6 = ERROR;
          }
          goto LAB_00122f38;
        }
LAB_00122b82:
        bVar8 = pbVar2[1];
        pbVar2 = pbVar2 + 1;
      }
      pbVar7 = pbVar2 + 1;
      goto LAB_00122b17;
    }
    if (bVar8 != 0xd) goto LAB_00122e6f;
    TVar4 = NEWLINE;
    pbVar2 = pbVar7 + 1;
    if (pbVar7[1] == 10) goto LAB_00122d40;
  }
  else if (bVar8 < 0x3b) {
    if (bVar8 != 0x2f) {
      if (bVar8 != 0x3a) goto LAB_00122f1d;
      pbVar3 = pbVar7 + 1;
      TVar6 = COLON;
      goto LAB_00122f38;
    }
  }
  else if (bVar8 < 0x3e) {
    if (bVar8 == 0x3d) {
      pbVar3 = pbVar7 + 1;
      TVar6 = EQUALS;
      goto LAB_00122f38;
    }
  }
  else if ((byte)(bVar8 + 0xbf) < 0x1a) goto LAB_00122f1d;
LAB_00122e6f:
  pbVar3 = pbVar7 + 1;
  TVar6 = ERROR;
  goto LAB_00122f38;
code_r0x00122b1f:
  pbVar2 = pbVar7 + 1;
  do {
    pbVar3 = pbVar2;
    bVar8 = *pbVar3;
    pbVar2 = pbVar3 + 1;
  } while (bVar8 == 0x20);
  if (bVar8 < 0xd) {
    TVar6 = INDENT;
    TVar4 = NEWLINE;
    pbVar2 = pbVar3;
    if (bVar8 == 10) goto LAB_00122d40;
  }
  else {
    if (bVar8 == 0x23) {
      bVar1 = false;
      pbVar2 = pbVar3;
      goto LAB_00122b82;
    }
    if ((bVar8 == 0xd) && (TVar4 = NEWLINE, *pbVar2 == 10)) {
LAB_00122d40:
      this->last_token_ = (char *)pbVar7;
      this->ofs_ = (char *)(pbVar2 + 1);
      return TVar4;
    }
    TVar6 = INDENT;
  }
LAB_00122f38:
  this->last_token_ = (char *)pbVar7;
  this->ofs_ = (char *)pbVar3;
  EatWhitespace(this);
  return TVar6;
}

Assistant:

Lexer::Token Lexer::ReadToken() {
  const char* p = ofs_;
  const char* q;
  const char* start;
  Lexer::Token token;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	unsigned int yyaccept = 0;
	static const unsigned char yybm[] = {
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128,   0, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		160, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 192, 192, 128, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 128, 128, 128, 128, 128, 128, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 192, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
	};
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '^') {
		if (yych <= ',') {
			if (yych <= '\f') {
				if (yych <= 0x00) goto yy2;
				if (yych == '\n') goto yy6;
				goto yy4;
			} else {
				if (yych <= '\r') goto yy8;
				if (yych == '#') goto yy12;
				goto yy4;
			}
		} else {
			if (yych <= ':') {
				if (yych == '/') goto yy4;
				if (yych <= '9') goto yy13;
				goto yy16;
			} else {
				if (yych <= '=') {
					if (yych <= '<') goto yy4;
					goto yy18;
				} else {
					if (yych <= '@') goto yy4;
					if (yych <= 'Z') goto yy13;
					goto yy4;
				}
			}
		}
	} else {
		if (yych <= 'i') {
			if (yych <= 'b') {
				if (yych == '`') goto yy4;
				if (yych <= 'a') goto yy13;
				goto yy20;
			} else {
				if (yych == 'd') goto yy21;
				if (yych <= 'h') goto yy13;
				goto yy22;
			}
		} else {
			if (yych <= 'r') {
				if (yych == 'p') goto yy23;
				if (yych <= 'q') goto yy13;
				goto yy24;
			} else {
				if (yych <= 'z') {
					if (yych <= 's') goto yy25;
					goto yy13;
				} else {
					if (yych == '|') goto yy26;
					goto yy4;
				}
			}
		}
	}
yy2:
	++p;
	{ token = TEOF;     break; }
yy4:
	++p;
yy5:
	{ token = ERROR;    break; }
yy6:
	++p;
	{ token = NEWLINE;  break; }
yy8:
	yych = *++p;
	if (yych == '\n') goto yy28;
	goto yy5;
yy9:
	yyaccept = 0;
	q = ++p;
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '\f') {
		if (yych == '\n') goto yy6;
	} else {
		if (yych <= '\r') goto yy30;
		if (yych == '#') goto yy32;
	}
yy11:
	{ token = INDENT;   break; }
yy12:
	yyaccept = 1;
	yych = *(q = ++p);
	if (yych <= 0x00) goto yy5;
	goto yy33;
yy13:
	++p;
	yych = *p;
yy14:
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = IDENT;    break; }
yy16:
	++p;
	{ token = COLON;    break; }
yy18:
	++p;
	{ token = EQUALS;   break; }
yy20:
	yych = *++p;
	if (yych == 'u') goto yy36;
	goto yy14;
yy21:
	yych = *++p;
	if (yych == 'e') goto yy37;
	goto yy14;
yy22:
	yych = *++p;
	if (yych == 'n') goto yy38;
	goto yy14;
yy23:
	yych = *++p;
	if (yych == 'o') goto yy39;
	goto yy14;
yy24:
	yych = *++p;
	if (yych == 'u') goto yy40;
	goto yy14;
yy25:
	yych = *++p;
	if (yych == 'u') goto yy41;
	goto yy14;
yy26:
	++p;
	if ((yych = *p) == '|') goto yy42;
	{ token = PIPE;     break; }
yy28:
	++p;
	{ token = NEWLINE;  break; }
yy30:
	yych = *++p;
	if (yych == '\n') goto yy28;
yy31:
	p = q;
	if (yyaccept == 0) {
		goto yy11;
	} else {
		goto yy5;
	}
yy32:
	++p;
	yych = *p;
yy33:
	if (yybm[0+yych] & 128) {
		goto yy32;
	}
	if (yych <= 0x00) goto yy31;
	++p;
	{ continue; }
yy36:
	yych = *++p;
	if (yych == 'i') goto yy44;
	goto yy14;
yy37:
	yych = *++p;
	if (yych == 'f') goto yy45;
	goto yy14;
yy38:
	yych = *++p;
	if (yych == 'c') goto yy46;
	goto yy14;
yy39:
	yych = *++p;
	if (yych == 'o') goto yy47;
	goto yy14;
yy40:
	yych = *++p;
	if (yych == 'l') goto yy48;
	goto yy14;
yy41:
	yych = *++p;
	if (yych == 'b') goto yy49;
	goto yy14;
yy42:
	++p;
	{ token = PIPE2;    break; }
yy44:
	yych = *++p;
	if (yych == 'l') goto yy50;
	goto yy14;
yy45:
	yych = *++p;
	if (yych == 'a') goto yy51;
	goto yy14;
yy46:
	yych = *++p;
	if (yych == 'l') goto yy52;
	goto yy14;
yy47:
	yych = *++p;
	if (yych == 'l') goto yy53;
	goto yy14;
yy48:
	yych = *++p;
	if (yych == 'e') goto yy55;
	goto yy14;
yy49:
	yych = *++p;
	if (yych == 'n') goto yy57;
	goto yy14;
yy50:
	yych = *++p;
	if (yych == 'd') goto yy58;
	goto yy14;
yy51:
	yych = *++p;
	if (yych == 'u') goto yy60;
	goto yy14;
yy52:
	yych = *++p;
	if (yych == 'u') goto yy61;
	goto yy14;
yy53:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = POOL;     break; }
yy55:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = RULE;     break; }
yy57:
	yych = *++p;
	if (yych == 'i') goto yy62;
	goto yy14;
yy58:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = BUILD;    break; }
yy60:
	yych = *++p;
	if (yych == 'l') goto yy63;
	goto yy14;
yy61:
	yych = *++p;
	if (yych == 'd') goto yy64;
	goto yy14;
yy62:
	yych = *++p;
	if (yych == 'n') goto yy65;
	goto yy14;
yy63:
	yych = *++p;
	if (yych == 't') goto yy66;
	goto yy14;
yy64:
	yych = *++p;
	if (yych == 'e') goto yy68;
	goto yy14;
yy65:
	yych = *++p;
	if (yych == 'j') goto yy70;
	goto yy14;
yy66:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = DEFAULT;  break; }
yy68:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = INCLUDE;  break; }
yy70:
	yych = *++p;
	if (yych != 'a') goto yy14;
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = SUBNINJA; break; }
}

  }

  last_token_ = start;
  ofs_ = p;
  if (token != NEWLINE && token != TEOF)
    EatWhitespace();
  return token;
}